

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_printer.cpp
# Opt level: O1

void printGraphViz(Graph *G)

{
  type *ptVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  ostream *poVar5;
  AdjList *g;
  type extraout_RDX;
  type extraout_RDX_00;
  type tVar6;
  long lVar7;
  type tVar8;
  type *ptVar9;
  long lVar10;
  EdgeIterator e;
  EdgeIterator e_end;
  undefined8 local_168;
  undefined1 uStack_160;
  undefined7 uStack_15f;
  undefined1 uStack_158;
  undefined7 uStack_157;
  char cStack_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  Graph *local_120;
  undefined8 local_118;
  undefined1 uStack_110;
  undefined7 uStack_10f;
  undefined1 uStack_108;
  undefined8 uStack_107;
  long local_f8;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_d0;
  undefined1 *local_40;
  undefined8 *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"digraph G",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
  cVar4 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  tVar8._0_4_ = (uint)cVar4;
  tVar8._4_4_ = 0;
  std::ostream::put('(');
  std::ostream::flush();
  lVar7 = (long)(G->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(G->super_type).m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  tVar6 = extraout_RDX;
  local_120 = G;
  if (lVar7 != 0) {
    lVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      tVar8._0_4_ = (uint)cVar4;
      tVar8._4_4_ = 0;
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      lVar10 = lVar10 + 1;
      tVar6 = extraout_RDX_00;
    } while (lVar7 >> 5 != lVar10);
  }
  uStack_158 = 0;
  uStack_157 = 0;
  cStack_150 = '\0';
  local_168 = 0;
  uStack_160 = 0;
  uStack_15f = 0;
  uStack_108 = 0;
  uStack_107 = 0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_10f = 0;
  ptVar9 = (type *)(local_120->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (type *)(local_120->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  local_d0.first.vEnd.m_value = (long)ptVar1 - (long)ptVar9 >> 5;
  if (ptVar1 == ptVar9) {
    local_d0.first.vCurr.m_value = 0;
    local_d0.first.edges.super_type.m_initialized = false;
  }
  else {
    tVar6 = *ptVar9;
    tVar8 = ptVar9[1];
    if (tVar8 == tVar6) {
      ptVar9 = ptVar9 + 5;
      local_d0.first.vCurr.m_value = 0;
      do {
        if (local_d0.first.vEnd.m_value - 1 == local_d0.first.vCurr.m_value) {
          local_d0.first.edges.super_type.m_initialized = false;
          local_d0.first.vCurr.m_value = local_d0.first.vEnd.m_value;
          goto LAB_00111ba8;
        }
        tVar6 = (type)((_Vector_impl_data *)(ptVar9 + -1))->_M_start;
        tVar8 = *ptVar9;
        ptVar9 = ptVar9 + 4;
        local_d0.first.vCurr.m_value = local_d0.first.vCurr.m_value + 1;
      } while (tVar8 == tVar6);
    }
    else {
      local_d0.first.vCurr.m_value = 0;
    }
    local_d0.first.edges.super_type.m_initialized = true;
  }
LAB_00111ba8:
  local_d0.first.vBegin.m_value = 0;
  if (local_d0.first.edges.super_type.m_initialized) {
    local_d0.first.edges.super_type.m_storage.dummy_.aligner_ = tVar6;
    local_d0.first.edges.super_type.m_storage.dummy_._8_8_ = local_d0.first.vCurr.m_value;
    local_d0.first.edges.super_type.m_storage.dummy_._16_8_ = tVar8;
    local_d0.first.edges.super_type.m_storage.dummy_._24_8_ = local_d0.first.vCurr.m_value;
  }
  local_d0.first.m_g = local_120;
  local_d0.second.vBegin.m_value = 0;
  local_d0.second.edges.super_type.m_initialized = false;
  local_d0.second.m_g = local_120;
  local_38 = &local_118;
  local_d0.second.vCurr.m_value = local_d0.first.vEnd.m_value;
  local_d0.second.vEnd.m_value = local_d0.first.vEnd.m_value;
  local_40 = (undefined1 *)&local_168;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_40,&local_d0);
  if (local_d0.second.edges.super_type.m_initialized == true) {
    local_d0.second.edges.super_type.m_initialized = false;
  }
  if (local_d0.first.edges.super_type.m_initialized == true) {
    local_d0.first.edges.super_type.m_initialized = false;
  }
LAB_00111c83:
  do {
    if (CONCAT71(uStack_15f,uStack_160) == CONCAT71(uStack_10f,uStack_110)) {
      if (CONCAT71(uStack_15f,uStack_160) == CONCAT71(uStack_157,uStack_158)) {
LAB_00111e07:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
        return;
      }
      if ((cStack_150 == '\0') || (uStack_107._7_1_ == '\0')) goto LAB_00111e77;
      if (local_148 == local_f8) goto LAB_00111e07;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
    if (cStack_150 == '\0') {
LAB_00111e77:
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                    "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> ",4);
    if (cStack_150 == '\0') goto LAB_00111e77;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [label=",8);
    if (cStack_150 == '\0') goto LAB_00111e77;
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,**(int **)(local_148 + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"];",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (cStack_150 == '\0') {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                    "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    local_148 = local_148 + 0x10;
    if (local_148 == local_138) {
      lVar7 = CONCAT71(uStack_15f,uStack_160);
      lVar10 = lVar7 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_157,uStack_158) + -1 == lVar7) {
          uStack_160 = uStack_158;
          uStack_15f = uStack_157;
          goto LAB_00111c83;
        }
        lVar2 = *(long *)(*(long *)(local_128 + 0x18) + -8 + lVar10);
        lVar3 = *(long *)(*(long *)(local_128 + 0x18) + lVar10);
        lVar10 = lVar10 + 0x20;
        lVar7 = lVar7 + 1;
      } while (lVar3 == lVar2);
      uStack_160 = (undefined1)lVar7;
      uStack_15f = (undefined7)((ulong)lVar7 >> 8);
      local_148 = lVar2;
      local_140 = lVar7;
      local_138 = lVar3;
      local_130 = lVar7;
    }
  } while( true );
}

Assistant:

void printGraphViz(Graph G)
{
    std::cout << "digraph G" << std::endl;
    std::cout << "{" << std::endl;

    VertexIterator v, v_end;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        std::cout << "   " << *v << ";" << std::endl;
    }

    EdgeIterator e, e_end;
    for(boost::tie(e, e_end) = boost::edges(G); e != e_end; ++e) {
        std::cout << "   " << source(*e, G) << " -> " << target(*e, G);
        std::cout << " [label=" << G[*e].weight << "];" << std::endl;
    }

    std::cout << "}" << std::endl;
}